

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_signed_distance(REF_GRID ref_grid,REF_DBL *field,REF_DBL *distance)

{
  size_t __size;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  int iVar6;
  void *__s;
  ulong uVar7;
  long lVar8;
  int cell;
  REF_INT cell_00;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  double dVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar18;
  double dVar19;
  REF_DBL gradient [3];
  REF_INT nodes [27];
  double local_c8;
  double local_c0;
  double local_b8;
  int local_a8 [30];
  
  ref_node = ref_grid->node;
  iVar6 = ref_node->max;
  if ((long)iVar6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x589,
           "ref_phys_signed_distance","malloc set of REF_INT negative");
    RVar4 = 1;
  }
  else {
    ref_cell = ref_grid->cell[3];
    __size = (long)iVar6 * 4;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x589,
             "ref_phys_signed_distance","malloc set of REF_INT NULL");
      RVar4 = 2;
    }
    else {
      if (iVar6 != 0) {
        memset(__s,0,__size);
      }
      iVar6 = ref_cell->max;
      if (0 < iVar6) {
        cell = 0;
        do {
          RVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
          if (RVar4 == 0) {
            dVar12 = field[local_a8[0]];
            dVar14 = field[local_a8[1]];
            dVar17 = dVar12;
            if (dVar14 <= dVar12) {
              dVar17 = dVar14;
            }
            dVar18 = field[local_a8[2]];
            if (dVar18 <= dVar17) {
              dVar17 = dVar18;
            }
            if (dVar17 <= 0.0) {
              if (dVar12 <= dVar14) {
                dVar12 = dVar14;
              }
              if (dVar12 <= dVar18) {
                dVar12 = dVar18;
              }
              if (0.0 <= dVar12) {
                uVar5 = ref_node_tri_grad_nodes(ref_node,local_a8,field,&local_c8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x58f,"ref_phys_signed_distance",(ulong)uVar5,"grad");
                  return uVar5;
                }
                iVar6 = ref_cell->node_per;
                if (0 < (long)iVar6) {
                  dVar14 = SQRT(local_b8 * local_b8 + local_c8 * local_c8 + local_c0 * local_c0);
                  dVar12 = dVar14 * 1e+20;
                  if (dVar12 <= -dVar12) {
                    dVar12 = -dVar12;
                  }
                  lVar8 = 0;
                  do {
                    lVar9 = (long)local_a8[lVar8];
                    dVar17 = field[lVar9];
                    dVar18 = dVar17;
                    if (dVar17 <= -dVar17) {
                      dVar18 = -dVar17;
                    }
                    distance[lVar9] =
                         (REF_DBL)(-(ulong)(dVar18 < dVar12) & (ulong)(dVar17 / dVar14));
                    *(undefined4 *)((long)__s + lVar9 * 4) = 1;
                    lVar8 = lVar8 + 1;
                  } while (iVar6 != lVar8);
                }
              }
            }
          }
          cell = cell + 1;
          iVar6 = ref_cell->max;
        } while (cell < iVar6);
      }
      do {
        if (iVar6 < 1) break;
        bVar3 = false;
        cell_00 = 0;
        do {
          RVar4 = ref_cell_nodes(ref_cell,cell_00,local_a8);
          if (((RVar4 == 0) &&
              (*(int *)((long)__s + (long)local_a8[1] * 4) +
               *(int *)((long)__s + (long)local_a8[0] * 4) +
               *(int *)((long)__s + (long)local_a8[2] * 4) == 2)) &&
             (iVar6 = ref_cell->node_per, 0 < (long)iVar6)) {
            uVar7 = 0;
            do {
              lVar8 = (long)local_a8[uVar7];
              if (*(int *)((long)__s + lVar8 * 4) == 0) {
                pRVar1 = ref_node->real;
                lVar9 = (long)local_a8[(int)((uint)(uVar7 < 2) * 3 + (int)uVar7 + -2)];
                lVar11 = (long)(local_a8[uVar7] * 0xf);
                dVar12 = pRVar1[lVar9 * 0xf] - pRVar1[lVar11];
                dVar14 = pRVar1[lVar9 * 0xf + 2] - pRVar1[lVar11 + 2];
                auVar13._0_8_ = dVar12 * dVar12;
                auVar13._8_8_ = dVar14 * dVar14;
                lVar10 = uVar7 - 1;
                if (uVar7 == 0) {
                  lVar10 = 2;
                }
                lVar10 = (long)local_a8[lVar10];
                dVar18 = pRVar1[lVar10 * 0xf] - pRVar1[lVar11];
                dVar19 = pRVar1[lVar10 * 0xf + 2] - pRVar1[lVar11 + 2];
                dVar12 = distance[lVar10];
                dVar14 = pRVar1[lVar9 * 0xf + 1] - pRVar1[lVar11 + 1];
                dVar17 = pRVar1[lVar10 * 0xf + 1] - pRVar1[lVar11 + 1];
                auVar2._8_8_ = dVar19 * dVar19 + dVar18 * dVar18 + dVar17 * dVar17;
                auVar2._0_8_ = auVar13._8_8_ + auVar13._0_8_ + dVar14 * dVar14;
                auVar13 = sqrtpd(auVar13,auVar2);
                auVar15._8_8_ = dVar12;
                auVar15._0_8_ = distance[lVar9];
                auVar16._8_8_ = -dVar12;
                auVar16._0_8_ = -distance[lVar9];
                auVar16 = maxpd(auVar15,auVar16);
                dVar14 = auVar16._0_8_ + auVar13._0_8_;
                dVar17 = auVar16._8_8_ + auVar13._8_8_;
                if (dVar17 <= dVar14) {
                  dVar14 = dVar17;
                }
                distance[lVar8] =
                     (REF_DBL)((ulong)-dVar14 & -(ulong)(dVar12 < 0.0) |
                              ~-(ulong)(dVar12 < 0.0) & (ulong)dVar14);
                *(undefined4 *)((long)__s + lVar8 * 4) = 1;
                bVar3 = true;
              }
              uVar7 = uVar7 + 1;
            } while ((long)iVar6 != uVar7);
          }
          cell_00 = cell_00 + 1;
          iVar6 = ref_cell->max;
        } while (cell_00 < iVar6);
      } while (bVar3);
      free(__s);
      RVar4 = 0;
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_phys_signed_distance(REF_GRID ref_grid, REF_DBL *field,
                                            REF_DBL *distance) {
  REF_DBL node_min, node_max;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL gradient[3], slope, dist, len;
  REF_INT cell_node, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *set;
  REF_BOOL update;
  REF_INT passes;
  ref_malloc_init(set, ref_node_max(ref_node), REF_INT, 0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    node_min = MIN(MIN(field[nodes[0]], field[nodes[1]]), field[nodes[2]]);
    node_max = MAX(MAX(field[nodes[0]], field[nodes[1]]), field[nodes[2]]);
    if (node_min <= 0.0 && 0.0 <= node_max) {
      RSS(ref_node_tri_grad_nodes(ref_node, nodes, field, gradient), "grad");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        slope = sqrt(gradient[0] * gradient[0] + gradient[1] * gradient[1] +
                     gradient[2] * gradient[2]);
        if (ref_math_divisible(field[nodes[cell_node]], slope)) {
          distance[nodes[cell_node]] = field[nodes[cell_node]] / slope;
        } else {
          distance[nodes[cell_node]] = 0.0;
        }
        set[nodes[cell_node]] = 1;
      }
    }
  }

  update = REF_TRUE;
  passes = 0;
  while (update) {
    update = REF_FALSE;
    passes++;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (2 == set[nodes[0]] + set[nodes[1]] + set[nodes[2]]) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          if (0 == set[nodes[cell_node]]) {
            dist = 0;
            node = cell_node + 1;
            if (2 < node) node -= 3;
            len = sqrt(pow(ref_node_xyz(ref_node, 0, nodes[node]) -
                               ref_node_xyz(ref_node, 0, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 1, nodes[node]) -
                               ref_node_xyz(ref_node, 1, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 2, nodes[node]) -
                               ref_node_xyz(ref_node, 2, nodes[cell_node]),
                           2));
            dist = ABS(distance[nodes[node]]) + len;
            node = cell_node + 2;
            if (2 < node) node -= 3;
            len = sqrt(pow(ref_node_xyz(ref_node, 0, nodes[node]) -
                               ref_node_xyz(ref_node, 0, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 1, nodes[node]) -
                               ref_node_xyz(ref_node, 1, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 2, nodes[node]) -
                               ref_node_xyz(ref_node, 2, nodes[cell_node]),
                           2));

            dist = MIN(dist, ABS(distance[nodes[node]]) + len);
            if (distance[nodes[node]] >= 0.0) {
              distance[nodes[cell_node]] = dist;
            } else {
              distance[nodes[cell_node]] = -dist;
            }
            set[nodes[cell_node]] = 1;
            update = REF_TRUE;
          }
        }
      }
    }
  }

  ref_free(set);
  return REF_SUCCESS;
}